

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  void *pvVar7;
  int *piVar8;
  int iVar9;
  uint max_ii;
  ulong uVar10;
  ulong uVar11;
  short *psVar12;
  int k;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint max_kk;
  char *pcVar16;
  int m_1;
  long lVar17;
  Mat local_178;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  Mat *local_110;
  ulong local_108;
  short *local_100;
  long local_f8;
  Mat *local_f0;
  long local_e8;
  ulong local_e0;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat local_c8;
  Mat m;
  
  local_f0 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
  local_128 = (ulong)(uint)TILE_M;
  uVar14 = (long)(outch + TILE_M + -1) / (long)TILE_M;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_120 = (ulong)(uint)outch;
  Mat::create(&local_c8,TILE_K * TILE_M * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  iVar9 = (int)uVar14;
  local_110 = AT;
  Mat::create(AT,TILE_K * TILE_M,0x24,(inch + TILE_K + -1) / TILE_K,iVar9,4,(Allocator *)0x0);
  local_118 = uVar14 & 0xffffffff;
  if (iVar9 < 1) {
    local_118 = 0;
  }
  local_f8 = (long)inch;
  local_108 = (ulong)(uint)inch;
  for (uVar14 = 0; uVar14 != local_118; uVar14 = uVar14 + 1) {
    iVar9 = get_omp_thread_num();
    m.elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    local_100 = (short *)((long)iVar9 * local_c8.cstep * m.elemsize + (long)local_c8.data);
    m.data = local_100;
    m.refcount = (int *)0x0;
    m.elempack = local_c8.elempack;
    m.allocator = local_c8.allocator;
    m.w = local_c8.w;
    m.h = local_c8.h;
    m.d = 1;
    m.c = local_c8.d;
    m.cstep = (m.elemsize * (long)local_c8.h * (long)local_c8.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = local_c8.dims + -1;
    if (local_c8.dims == 4) {
      m.cstep = (long)local_c8.h * (long)local_c8.w;
    }
    local_e8 = uVar14 * local_128;
    max_ii = (int)local_120 - (int)(uVar14 * local_128);
    if ((int)(uint)local_128 < (int)max_ii) {
      max_ii = (uint)local_128;
    }
    local_e0 = 0;
    if (0 < (int)max_ii) {
      local_e0 = (ulong)max_ii;
    }
    for (uVar13 = 0; (long)uVar13 < local_f8; uVar13 = uVar13 + (long)TILE_K) {
      max_kk = (int)local_108 - (int)uVar13;
      if (TILE_K < (int)max_kk) {
        max_kk = TILE_K;
      }
      uVar10 = 0;
      if (0 < (int)max_kk) {
        uVar10 = (ulong)max_kk;
      }
      psVar12 = local_100;
      for (uVar11 = 0; uVar11 != local_e0; uVar11 = uVar11 + 1) {
        pvVar7 = local_f0->data;
        for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
          pcVar16 = (char *)((long)pvVar7 +
                            (uVar15 + uVar13) * 9 + (long)(((int)local_e8 + (int)uVar11) * inch * 9)
                            );
          for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
            cVar1 = *pcVar16;
            cVar2 = pcVar16[1];
            cVar3 = pcVar16[2];
            *(short *)((long)&local_178.data + lVar17 * 2) = cVar1 * 6;
            *(short *)((long)&local_178.data + lVar17 * 2 + 6) =
                 -(cVar3 * 4 + cVar2 * 4 + cVar1 * 4);
            *(short *)((long)&local_178.refcount + lVar17 * 2 + 4) =
                 cVar2 * 4 + cVar1 * -4 + cVar3 * -4;
            *(short *)((long)&local_178.elemsize + lVar17 * 2 + 2) =
                 (short)cVar1 + cVar2 * 2 + cVar3 * 4;
            *(short *)((long)&local_178.elempack + lVar17 * 2) =
                 ((short)cVar1 - ((short)cVar2 + (short)cVar2)) + cVar3 * 4;
            *(short *)(&local_178.field_0x1e + lVar17 * 2) = cVar3 * 6;
            pcVar16 = pcVar16 + 3;
          }
          for (lVar17 = 0; lVar17 != 0x24; lVar17 = lVar17 + 6) {
            sVar4 = *(short *)((long)&local_178.data + lVar17);
            sVar5 = *(short *)((long)&local_178.data + lVar17 + 2);
            sVar6 = *(short *)((long)&local_178.data + lVar17 + 4);
            *psVar12 = sVar4 * 6;
            psVar12[1] = -(sVar6 * 4 + sVar5 * 4 + sVar4 * 4);
            psVar12[2] = sVar5 * 4 + sVar4 * -4 + sVar6 * -4;
            psVar12[3] = sVar4 + sVar5 * 2 + sVar6 * 4;
            psVar12[4] = sVar4 + sVar5 * -2 + sVar6 * 4;
            psVar12[5] = sVar6 * 6;
            psVar12 = psVar12 + 6;
          }
        }
      }
      local_178.w = local_110->w;
      local_178.h = local_110->h;
      local_178.elemsize = local_110->elemsize;
      local_178.elempack = local_110->elempack;
      local_178.allocator = local_110->allocator;
      local_178.cstep = (long)local_178.h * (long)local_178.w;
      local_178.data =
           (void *)((long)local_110->data +
                   local_178.elemsize * local_178.cstep *
                   (long)(int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                     uVar13 & 0xffffffff) / (long)TILE_K) +
                   local_110->cstep * uVar14 * local_178.elemsize);
      local_178.refcount = (int *)0x0;
      local_178.dims = 2;
      local_178.d = 1;
      local_178.c = 1;
      pack_A_tile_int8(&m,&local_178,0x24,max_ii,max_kk);
    }
  }
  piVar8 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_int8(kernel, AT, inch, outch, opt);
}